

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

int doread(obj *scroll)

{
  undefined1 auVar1 [16];
  boolean bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_258;
  uint local_244;
  char *local_240;
  char *what;
  char tmp [256];
  char local_128 [4];
  int erosion;
  char buf [256];
  boolean local_1a;
  char local_19;
  boolean known;
  obj *poStack_18;
  boolean confused;
  obj *scroll_local;
  
  local_1a = '\0';
  poStack_18 = scroll;
  bVar2 = check_capacity((char *)0x0);
  if (bVar2 == '\0') {
    if ((poStack_18 == (obj *)0x0) ||
       (bVar2 = validate_object(poStack_18,"\f\x14\t\n","read"), bVar2 != '\0')) {
      if (poStack_18 == (obj *)0x0) {
        poStack_18 = getobj("\f\x14\t\n","read",(obj **)0x0);
      }
      if (poStack_18 == (obj *)0x0) {
        scroll_local._4_4_ = 0;
      }
      else if (poStack_18->otyp == 0x122) {
        if (flags.verbose != '\0') {
          pline("You break up the cookie and throw away the pieces.");
        }
        if (u.roleplay.illiterate == '\0') {
          iVar3 = bcsign(poStack_18);
          outrumor(iVar3,1);
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            violated(8);
          }
        }
        else {
          pline("The cookie had a scrap of paper inside.");
          pline("What a pity that you cannot read!");
        }
        useup(poStack_18);
        scroll_local._4_4_ = 1;
      }
      else if (poStack_18->otyp == 0x7b) {
        if ((((u.uprops[0x1e].intrinsic == 0) &&
             ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          if (u.roleplay.illiterate == '\0') {
            violated(8);
            if (flags.verbose != '\0') {
              pline("It reads:");
            }
            strcpy(local_128,doread::shirt_msgs[(ulong)poStack_18->o_id % 0x43]);
            if ((*(uint *)&poStack_18->field_0x4a >> 10 & 3) <
                (*(uint *)&poStack_18->field_0x4a >> 8 & 3)) {
              local_244 = *(uint *)&poStack_18->field_0x4a >> 8;
            }
            else {
              local_244 = *(uint *)&poStack_18->field_0x4a >> 10;
            }
            local_244 = local_244 & 3;
            if (local_244 != 0) {
              sVar4 = strlen(local_128);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = sVar4 * (long)(int)local_244;
              wipeout_text(local_128,SUB164(auVar1 / ZEXT816(6),0),
                           poStack_18->o_id ^ (uint)u.ubirthday);
            }
            pline("\"%s\"",local_128);
            scroll_local._4_4_ = 1;
          }
          else {
            pline("Unfortunately, you cannot read.");
            scroll_local._4_4_ = 0;
          }
        }
        else {
          pline("You can\'t feel any Braille writing.");
          scroll_local._4_4_ = 0;
        }
      }
      else if (poStack_18->otyp == 0xe4) {
        if (u.roleplay.illiterate == '\0') {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            if (flags.verbose != '\0') {
              pline("It reads:");
            }
            if (poStack_18->oartifact == '\0') {
              local_258 = doread::card_msgs[(ulong)poStack_18->o_id % 0xd];
            }
            else {
              local_258 = doread::card_msgs[0xd];
            }
            pline("\"%s\"",local_258);
          }
          else {
            pline("You feel the embossed numbers:");
          }
          pline("\"%d0%d %d%d1 0%d%d0\"",(ulong)(poStack_18->o_id % 0x59 + 10),
                (ulong)(poStack_18->o_id & 3),(ulong)((poStack_18->o_id * 499) % 899999 + 100000),
                (ulong)poStack_18->o_id % 10,(ulong)((poStack_18->o_id % 3 != 0 ^ 0xffU) & 1),
                (poStack_18->o_id * 7) % 10);
          violated(8);
          scroll_local._4_4_ = 1;
        }
        else {
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            if (flags.verbose != '\0') {
              pcVar5 = xname(poStack_18);
              pline("There is writing on the %s.",pcVar5);
            }
          }
          else {
            pline("You feel embossed writing.");
          }
          pline("Unfortunately, you cannot read.");
          scroll_local._4_4_ = 0;
        }
      }
      else if (((poStack_18->otyp == 0x129) || (poStack_18->otyp == 0xf5)) ||
              (poStack_18->otyp == 0x121)) {
        pcVar5 = singular(poStack_18,xname);
        pcVar6 = "label";
        if (poStack_18->otyp == 0x121) {
          pcVar6 = "wrapper";
        }
        pline("This %s has no %s.",pcVar5,pcVar6);
        scroll_local._4_4_ = 0;
      }
      else if (poStack_18->otyp == 0xf7) {
        if ((((u.uprops[0x1e].intrinsic == 0) &&
             ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          if (u.roleplay.illiterate == '\0') {
            if (flags.verbose != '\0') {
              pline("It reads:");
            }
            pline("\"Magic Marker(TM) Red Ink Marker Pen. Water Soluble.\"");
            violated(8);
            scroll_local._4_4_ = 1;
          }
          else {
            if (flags.verbose != '\0') {
              pcVar5 = xname(poStack_18);
              pline("There is writing on the %s.",pcVar5);
            }
            pline("Unfortunately, you cannot read.");
            scroll_local._4_4_ = 0;
          }
        }
        else {
          pline("You can\'t feel any Braille writing.");
          scroll_local._4_4_ = 0;
        }
      }
      else if (poStack_18->oclass == '\f') {
        if (u.roleplay.illiterate == '\0') {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            if (flags.verbose != '\0') {
              pline("You read:");
            }
          }
          else {
            pline("You feel the embossed words:");
          }
          pcVar5 = currency(1);
          strcpy((char *)&what,pcVar5);
          pcVar5 = upstart((char *)&what);
          pline("\"1 %s. 857 GUE. In Frobs We Trust.\"",pcVar5);
          violated(8);
          scroll_local._4_4_ = 1;
        }
        else {
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            if (flags.verbose != '\0') {
              pcVar5 = singular(poStack_18,xname);
              pline("There is writing on the %s.",pcVar5);
            }
          }
          else {
            pline("You feel the embossed words.");
          }
          pline("Unfortunately, you cannot read.");
          scroll_local._4_4_ = 0;
        }
      }
      else if (poStack_18->oartifact == '#') {
        if (u.roleplay.illiterate == '\0') {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pline("It is signed:");
          }
          else {
            pline("You feel the engraved signature:");
          }
          pline("\"Odin.\"");
          violated(8);
          scroll_local._4_4_ = 1;
        }
        else {
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            if (flags.verbose != '\0') {
              pcVar5 = xname(poStack_18);
              pline("The %s is signed.",pcVar5);
            }
          }
          else {
            pline("You feel an engraved signature.");
          }
          pline("Unfortunately, you cannot read.");
          scroll_local._4_4_ = 0;
        }
      }
      else if ((obj_descr[objects[poStack_18->otyp].oc_descr_idx].oc_descr == (char *)0x0) ||
              (iVar3 = strncmp(obj_descr[objects[poStack_18->otyp].oc_descr_idx].oc_descr,"runed",5)
              , iVar3 != 0)) {
        if ((poStack_18->oclass == '\t') || (poStack_18->oclass == '\n')) {
          if ((u.roleplay.illiterate == '\0') || (poStack_18->otyp == 0x1bd)) {
            if (((u.uprops[0x1e].intrinsic != 0) ||
                (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
               (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                (poStack_18->otyp != 0x1bd)))) {
              local_240 = (char *)0x0;
              if (poStack_18->oclass == '\n') {
                local_240 = "mystic runes";
              }
              else if ((*(uint *)&poStack_18->field_0x4a >> 5 & 1) == 0) {
                local_240 = "formula on the scroll";
              }
              if (local_240 != (char *)0x0) {
                pline("Being blind, you cannot read the %s.",local_240);
                return 0;
              }
            }
            if (((poStack_18->otyp != 0x1bd) && (poStack_18->otyp != 0x1bc)) &&
               (poStack_18->otyp != 0x17c)) {
              violated(8);
            }
            local_19 = u.uprops[0x1c].intrinsic != 0;
            if (poStack_18->oclass == '\n') {
              scroll_local._4_4_ = study_book(poStack_18);
            }
            else {
              *(uint *)&poStack_18->field_0x4a =
                   *(uint *)&poStack_18->field_0x4a & 0xff7fffff | 0x800000;
              if (poStack_18->otyp != 0x17c) {
                if (((u.uprops[0x1e].intrinsic == 0) &&
                    (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                     (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                  pline("As you read the scroll, it disappears.");
                }
                else {
                  pcVar5 = "pronounce";
                  if ((youmonst.data)->msound == '\0') {
                    pcVar5 = "cogitate";
                  }
                  pline("As you %s the formula on it, the scroll disappears.",pcVar5);
                }
                if (local_19 != '\0') {
                  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
                     ((u.umonnum != u.umonster &&
                      (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
                    pcVar5 = "pronounce";
                    if ((youmonst.data)->msound == '\0') {
                      pcVar5 = "understand";
                    }
                    pline("Being confused, you mis%s the magic words...",pcVar5);
                  }
                  else {
                    pline("Being so trippy, you screw up...");
                  }
                }
              }
              iVar3 = seffects(poStack_18,&local_1a);
              if (iVar3 == 0) {
                if ((objects[poStack_18->otyp].field_0x10 & 1) == 0) {
                  if (local_1a == '\0') {
                    if (objects[poStack_18->otyp].oc_uname == (char *)0x0) {
                      docall(poStack_18);
                    }
                  }
                  else {
                    discover_object((int)poStack_18->otyp,'\x01','\x01');
                    more_experienced(0,0,10);
                  }
                }
                if (poStack_18->otyp == 0x17c) {
                  *(uint *)&poStack_18->field_0x4a = *(uint *)&poStack_18->field_0x4a & 0xff7fffff;
                }
                else {
                  useup(poStack_18);
                }
              }
              scroll_local._4_4_ = 1;
            }
          }
          else {
            pline("Unfortunately, you cannot read.");
            scroll_local._4_4_ = 0;
          }
        }
        else {
          pline("That is a silly thing to read.");
          scroll_local._4_4_ = 0;
        }
      }
      else if (poStack_18->otyp == 0x2a) {
        pline("You can\'t decipher the arcane runes.");
        scroll_local._4_4_ = 0;
      }
      else if ((urace.malenum == 0x111) || (urole.malenum == 0x159)) {
        if (u.roleplay.illiterate == '\0') {
          violated(8);
          if (((byte)objects[poStack_18->otyp].field_0x10 >> 1 & 1) == 0) {
            if (((u.uprops[0x1e].intrinsic == 0) &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              pline("It is signed:");
            }
            else {
              pline("You feel the engraved signature:");
            }
            pline("\"%s%s%s\"",doread::elf_syllable1[(ulong)poStack_18->o_id % 0x22],
                  doread::elf_syllable2[(ulong)poStack_18->o_id % 0x11],
                  doread::elf_syllable3[(ulong)poStack_18->o_id % 0x1a]);
            scroll_local._4_4_ = 1;
          }
          else {
            if ((((u.uprops[0x1e].intrinsic == 0) &&
                 ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              if (flags.verbose != '\0') {
                pline("The runes read:");
              }
            }
            else {
              pline("You feel the engraved runes:");
            }
            pline("\"Made in Elfheim.\"");
            scroll_local._4_4_ = 1;
          }
        }
        else {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            if (flags.verbose != '\0') {
              pcVar5 = xname(poStack_18);
              pline("There are runes on the %s.",pcVar5);
            }
          }
          else {
            pline("You feel engraved runes.");
          }
          pline("Unfortunately, you cannot read.");
          scroll_local._4_4_ = 0;
        }
      }
      else {
        pline("You can\'t decipher the Elvish runes.");
        scroll_local._4_4_ = 0;
      }
    }
    else {
      scroll_local._4_4_ = 0;
    }
  }
  else {
    scroll_local._4_4_ = 0;
  }
  return scroll_local._4_4_;
}

Assistant:

int doread(struct obj *scroll)
{
	boolean confused, known;

	known = FALSE;
	if (check_capacity(NULL)) return 0;
	
	if (scroll && !validate_object(scroll, readable, "read"))
	    return 0;
	else if (!scroll)
	    scroll = getobj(readable, "read", NULL);
	if (!scroll) return 0;

	/* outrumor has its own blindness check */
	if (scroll->otyp == FORTUNE_COOKIE) {
	    if (flags.verbose)
		pline("You break up the cookie and throw away the pieces.");
	    if (u.roleplay.illiterate) {
		pline("The cookie had a scrap of paper inside.");
		pline("What a pity that you cannot read!");
	    } else {
		outrumor(bcsign(scroll), BY_COOKIE);
		if (!Blind) violated(CONDUCT_ILLITERACY);
	    }
	    useup(scroll);
	    return 1;
	} else if (scroll->otyp == T_SHIRT) {
	    static const char *const shirt_msgs[] = { /* Scott Bigham */
    "I explored the Dungeons of Doom and all I got was this lousy T-shirt!",
    "Is that Mjollnir in your pocket or are you just happy to see me?",
    "It's not the size of your sword, it's how #enhance'd you are with it.",
    "Madame Elvira's House O' Succubi Lifetime Customer",
    "Madame Elvira's House O' Succubi Employee of the Month",
    "Ludios Vault Guards Do It In Small, Dark Rooms",
    "Yendor Military Soldiers Do It In Large Groups",
    "I survived Yendor Military Boot Camp",
    "Ludios Accounting School Intra-Mural Lacrosse Team",
    "Oracle(TM) Fountains 10th Annual Wet T-Shirt Contest",
    "Hey, black dragon!  Disintegrate THIS!",
    "I'm With Stupid -->",
    "Don't blame me, I voted for Izchak!",
    "Frodo Lives!",
    "Actually, I AM a quantum mechanic.",
    "I beat the Sword Master",			/* Monkey Island */
    "Don't Panic",				/* HHGTTG */
    "Furinkan High School Athletic Dept.",	/* Ranma 1/2 */
    "Hel-LOOO, Nurse!",			/* Animaniacs */
    /* NAO */
    "=^.^=",
    "100% goblin hair - do not wash",
    "Aim >>> <<< here",
    "cK -- Cockatrice touches the Kop",
    "Don't ask me, I only adventure here",
    "Down With Pants!",
    "Gehennoms Angels",
    "Glutton For Punishment",
    "Go Team Ant!",
    "Got Newt?",
    "Heading for Godhead",
    "Hello, my darlings!", /* Charlie Drake */
    "Hey! Nymphs! Steal This T-Shirt!",
    "I <3 Dungeon of Doom",
    "I am a Valkyrie. If you see me running, try to keep up.",
    "I Am Not a Pack Rat - I Am a Collector",
    "I bounced off a rubber tree",
    "If you can read this, I can hit you with my polearm",
    "I Support Single Succubi",
    "I want to live forever or die in the attempt.",
    "Kop Killaz",
    "Lichen Park",
    "LOST IN THOUGHT - please send search party",
    "Minetown Watch",
    "Ms. Palm's House of Negotiable Affection -- A Very Reputable House Of Disrepute",
    "^^  My eyes are up there!  ^^",
    "Next time you wave at me, use more than one finger, please.",
    "Objects In This Shirt Are Closer Than They Appear",
    "Protection Racketeer",
    "P Happens",
    "Real men love Crom",
    "Sokoban Gym -- Get Strong or Die Trying",
    "Somebody stole my Mojo!",
    "The Hellhound Gang",
    "The Werewolves",
    "They Might Be Storm Giants",
    "Weapons don't kill people, I kill people",
    "White Zombie",
    "Worship me",
    "You laugh because I'm different, I laugh because you're about to die",
    "You should hear what the voices in my head are saying about you.",
    "Anhur State University - Home of the Fighting Fire Ants!",
    "FREE HUGS",
    "Serial Ascender",
    "I couldn't afford this T-shirt so I stole it!",
    "End Mercantile Opacity Discrimination Now: Let Invisible Customers Shop!",
    "Elvira's House O'Succubi, granting the gift of immorality!",
    /* UnNetHack */
    "I made a NetHack fork and all I got was this lousy T-shirt!",	/* galehar */
	    };
	    char buf[BUFSZ];
	    int erosion;

	    if (Blind) {
		pline("You can't feel any Braille writing.");
		return 0;
	    }
	    if (u.roleplay.illiterate) {
		pline("Unfortunately, you cannot read.");
		return 0;
	    } else {
		violated(CONDUCT_ILLITERACY);
		if (flags.verbose)
		    pline("It reads:");
		strcpy(buf, shirt_msgs[scroll->o_id % SIZE(shirt_msgs)]);
	    }
	    erosion = greatest_erosion(scroll);
	    if (erosion)
		wipeout_text(buf,
			(int)(strlen(buf) * erosion / (2*MAX_ERODE)),
			     scroll->o_id ^ (unsigned)u.ubirthday);
	    pline("\"%s\"", buf);
	    return 1;
	} else if (scroll->otyp == CREDIT_CARD) {
	    static const char *card_msgs[] = {
		"Leprechaun Gold Tru$t - Shamrock Card",
		"Magic Memory Vault Charge Card",
		"Larn National Bank", /* Larn */
		"First Bank of Omega", /* Omega */
		"Bank of Zork - Frobozz Magic Card", /* Zork */
		"Ankh-Morpork Merchant's Guild Barter Card",
		"Ankh-Morpork Thieves' Guild Unlimited Transaction Card",
		"Ransmannsby Moneylenders Association",
		"Bank of Gehennom - 99% Interest Card",
		"Yendorian Express - Copper Card",
		"Yendorian Express - Silver Card",
		"Yendorian Express - Gold Card",
		"Yendorian Express - Mithril Card",
		"Yendorian Express - Platinum Card",
	    };
	    if (u.roleplay.illiterate) {
		if (Blind)
		    pline("You feel embossed writing.");
		else if (flags.verbose)
		    pline("There is writing on the %s.", xname(scroll));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    if (Blind) {
		pline("You feel the embossed numbers:");
	    } else {
		if (flags.verbose)
		    pline("It reads:");
		pline("\"%s\"", scroll->oartifact ?
		      card_msgs[SIZE(card_msgs) - 1] :
		      card_msgs[scroll->o_id % (SIZE(card_msgs) - 1)]);
	    }
	    /* Make a credit card number */
	    pline("\"%d0%d %d%d1 0%d%d0\"",
		  (scroll->o_id % 89) + 10, scroll->o_id % 4,
		  ((scroll->o_id * 499) % 899999) + 100000, scroll->o_id % 10,
		  !(scroll->o_id % 3), (scroll->o_id * 7) % 10);
	    violated(CONDUCT_ILLITERACY);
	    return 1;
	} else if (scroll->otyp == TIN ||
		   scroll->otyp == CAN_OF_GREASE ||
		   scroll->otyp == CANDY_BAR) {
	    pline("This %s has no %s.", singular(scroll, xname),
		  scroll->otyp == CANDY_BAR ? "wrapper" : "label");
	    return 0;
	} else if (scroll->otyp == MAGIC_MARKER) {
	    if (Blind) {
		pline("You can't feel any Braille writing.");
		return 0;
	    }
	    if (u.roleplay.illiterate) {
		if (flags.verbose)
		    pline("There is writing on the %s.", xname(scroll));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    if (flags.verbose)
		pline("It reads:");
	    pline("\"Magic Marker(TM) Red Ink Marker Pen. Water Soluble.\"");
	    violated(CONDUCT_ILLITERACY);
	    return 1;
	} else if (scroll->oclass == COIN_CLASS) {
	    char tmp[BUFSZ];
	    if (u.roleplay.illiterate) {
		if (Blind)
		    pline("You feel the embossed words.");
		else if (flags.verbose)
		    pline("There is writing on the %s.", singular(scroll, xname));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    if (Blind)
		pline("You feel the embossed words:");
	    else if (flags.verbose)
		pline("You read:");
	    strcpy(tmp, currency(1));
	    pline("\"1 %s. 857 GUE. In Frobs We Trust.\"", upstart(tmp));
	    violated(CONDUCT_ILLITERACY);
	    return 1;
	} else if (scroll->oartifact == ART_ORB_OF_FATE) {
	    if (u.roleplay.illiterate) {
		if (Blind)
		    pline("You feel an engraved signature.");
		else if (flags.verbose)
		    pline("The %s is signed.", xname(scroll));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    if (Blind)
		pline("You feel the engraved signature:");
	    else
		pline("It is signed:");
	    pline("\"Odin.\"");
	    violated(CONDUCT_ILLITERACY);
	    return 1;
	} else if (OBJ_DESCR(objects[scroll->otyp]) &&
		   !strncmp(OBJ_DESCR(objects[scroll->otyp]), "runed", 5)) {
	    if (scroll->otyp == RUNESWORD) {
		pline("You can't decipher the arcane runes.");
		return 0;
	    } else if (!Race_if(PM_ELF) && !Role_if(PM_ARCHEOLOGIST)) {
		pline("You can't decipher the Elvish runes.");
		return 0;
	    }
	    if (u.roleplay.illiterate) {
		if (Blind)
		    pline("You feel engraved runes.");
		else if (flags.verbose)
		    pline("There are runes on the %s.", xname(scroll));
		pline("Unfortunately, you cannot read.");
		return 0;
	    }
	    violated(CONDUCT_ILLITERACY);
	    if (objects[scroll->otyp].oc_merge) {
		if (Blind)
		    pline("You feel the engraved runes:");
		else if (flags.verbose)
		    pline("The runes read:");
		pline("\"Made in Elfheim.\"");
		return 1;
	    } else {
		/* "Avoid any artifact with Runes on it, even if the Runes
		 *  prove only to spell the maker's name." -- Diana Wynne Jones
		 */
		/* Elf name fragments courtesy of ToME */
		static const char *elf_syllable1[] = {
		    "Al", "An",
		    "Bal", "Bel",
		    "Cal", "Cel",
		    "El", "Elr", "Elv", "Eow", "Ear",
		    "F", "Fal", "Fel", "Fin",
		    "G", "Gal", "Gel", "Gl",
		    "Is", "Lan", "Leg", "Lom",
		    "N", "Nal","Nel",
		    "S", "Sal", "Sel",
		    "T", "Tal", "Tel", "Thr", "Tin",
		};
		static const char *elf_syllable2[] = {
		    "a", "adrie", "ara",
		    "e", "ebri", "ele", "ere",
		    "i", "io", "ithra", "ilma", "il-Ga", "ili",
		    "o", "orfi",
		    "u",
		    "y",
		};
		static const char *elf_syllable3[] = {
		    "l", "las", "lad", "ldor", "ldur", "linde", "lith",
		    "mir", "mbor",
		    "n", "nd", "ndel", "ndil", "ndir", "nduil", "ng",
		    "r", "rith", "ril", "riand", "rion",
		    "s",
		    "thien",
		    "viel",
		    "wen", "wyn",
		};
		if (Blind)
		    pline("You feel the engraved signature:");
		else
		    pline("It is signed:");
		pline("\"%s%s%s\"",
		      elf_syllable1[scroll->o_id % SIZE(elf_syllable1)],
		      elf_syllable2[scroll->o_id % SIZE(elf_syllable2)],
		      elf_syllable3[scroll->o_id % SIZE(elf_syllable3)]);
		return 1;
	    }
	} else if (scroll->oclass != SCROLL_CLASS
		&& scroll->oclass != SPBOOK_CLASS) {
	    pline("That is a silly thing to read.");
	    return 0;
	} else if (u.roleplay.illiterate && scroll->otyp != SPE_BOOK_OF_THE_DEAD) {
	    pline("Unfortunately, you cannot read.");
	    return 0;
	} else if (Blind && scroll->otyp != SPE_BOOK_OF_THE_DEAD) {
	    const char *what = 0;
	    if (scroll->oclass == SPBOOK_CLASS)
		what = "mystic runes";
	    else if (!scroll->dknown)
		what = "formula on the scroll";
	    if (what) {
		pline("Being blind, you cannot read the %s.", what);
		return 0;
	    }
	}

	/* Actions required to win the game aren't counted towards conduct */
	if (scroll->otyp != SPE_BOOK_OF_THE_DEAD &&
		scroll->otyp != SPE_BLANK_PAPER &&
		scroll->otyp != SCR_BLANK_PAPER)
	    violated(CONDUCT_ILLITERACY);

	confused = (Confusion != 0);
	if (scroll->oclass == SPBOOK_CLASS) {
	    return study_book(scroll);
	}
	scroll->in_use = TRUE;	/* scroll, not spellbook, now being read */
	if (scroll->otyp != SCR_BLANK_PAPER) {
	  if (Blind)
	    pline("As you %s the formula on it, the scroll disappears.",
			is_silent(youmonst.data) ? "cogitate" : "pronounce");
	  else
	    pline("As you read the scroll, it disappears.");
	  if (confused) {
	    if (Hallucination)
		pline("Being so trippy, you screw up...");
	    else
		pline("Being confused, you mis%s the magic words...",
			is_silent(youmonst.data) ? "understand" : "pronounce");
	  }
	}
	if (!seffects(scroll, &known))  {
		if (!objects[scroll->otyp].oc_name_known) {
		    if (known) {
			makeknown(scroll->otyp);
			more_experienced(0, 0, 10);
		    } else if (!objects[scroll->otyp].oc_uname)
			docall(scroll);
		}
		if (scroll->otyp != SCR_BLANK_PAPER)
			useup(scroll);
		else scroll->in_use = FALSE;
	}
	return 1;
}